

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::__cxx11::string>,256,true>>
::insert_multi<std::__cxx11::string_const&>
          (btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::__cxx11::string>,256,true>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *v)

{
  node_type *pnVar1;
  iterator iVar2;
  
  if (*(long *)(this + 0x10) == 0) {
    pnVar1 = btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
             ::new_leaf_root_node
                       ((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                         *)this,1);
    *(node_type **)(this + 8) = pnVar1;
    *(node_type **)this = pnVar1;
  }
  iVar2 = internal_upper_bound<std::__cxx11::string>(this,v);
  if (iVar2.node ==
      (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
       *)0x0) {
    iVar2 = btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::end((btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                   *)this);
  }
  iVar2 = internal_emplace<std::__cxx11::string_const&>(this,iVar2,v);
  return iVar2;
}

Assistant:

iterator insert_multi(ValueType &&v) {
            return insert_multi(params_type::key(v), std::forward<ValueType>(v));
        }